

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O3

void __thiscall VTAdjacencyTest::checkMesh(VTAdjacencyTest *this,aiMesh *mesh)

{
  aiFace *paVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char *in_R9;
  uint uVar9;
  uint qq;
  long lVar10;
  uint *puVar11;
  AssertionResult gtest_ar_;
  uint tt;
  AssertionResult gtest_ar;
  uint num;
  VertexTriangleAdjacency adj;
  Message local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  uint local_9c;
  string local_98;
  aiMesh *local_78;
  ulong local_70;
  uint *local_68;
  AssertHelper local_60;
  uint **local_58;
  VertexTriangleAdjacency local_50;
  
  Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
            (&local_50,mesh->mFaces,mesh->mNumFaces,mesh->mNumVertices,true);
  local_68 = local_50.mLiveTriangles;
  local_78 = mesh;
  if (mesh->mNumFaces != 0) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      local_58 = &local_78->mFaces[uVar7].mIndices;
      lVar10 = 0;
      do {
        uVar5 = uVar6;
        uVar9 = local_68[(*local_58)[lVar10]];
        local_70 = (ulong)local_50.mOffsetTable[(*local_58)[lVar10]];
        uVar6 = local_50.mOffsetTable[(*local_58)[lVar10]] + uVar9;
        if (uVar6 <= uVar5) {
          uVar6 = uVar5;
        }
        local_9c = 0;
        if (uVar9 != 0) {
          lVar4 = 0;
          do {
            if (uVar7 == local_50.mAdjacencyTable[local_70 + lVar4]) {
              local_50.mAdjacencyTable[local_70 + lVar4] = 0xffffffff;
              break;
            }
            lVar4 = lVar4 + 1;
            local_9c = (uint)lVar4;
          } while (uVar9 != local_9c);
        }
        local_60.data_._0_4_ = uVar9;
        testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                  ((internal *)&local_98,"tt","num",&local_9c,(uint *)&local_60);
        if ((char)local_98._M_dataplus._M_p == '\0') {
          testing::Message::Message(&local_b8);
          pcVar8 = "";
          if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
            pcVar8 = *(char **)local_98._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xc4,pcVar8);
          testing::internal::AssertHelper::operator=(&local_a8,&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if (((CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      uVar7 = uVar7 + 1;
      uVar3 = local_78->mNumFaces;
    } while (uVar7 < uVar3);
    if (uVar6 != 0) {
      uVar9 = (int)local_70 + uVar9;
      if (uVar9 < uVar5) {
        uVar9 = uVar5;
      }
      puVar11 = local_50.mAdjacencyTable;
      do {
        local_b8.ss_.ptr_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&local_98,"0xffffffff","*pi",(uint *)&local_b8,puVar11);
        if ((char)local_98._M_dataplus._M_p == '\0') {
          testing::Message::Message(&local_b8);
          pcVar8 = "";
          if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
            pcVar8 = *(char **)local_98._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xcc,pcVar8);
          testing::internal::AssertHelper::operator=(&local_a8,&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if (((CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        puVar11 = puVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      uVar3 = local_78->mNumFaces;
    }
    if (uVar3 != 0) {
      uVar7 = 0;
      do {
        paVar1 = local_78->mFaces;
        lVar10 = 0;
        local_70 = uVar7;
        do {
          local_b8.ss_.ptr_._0_4_ = 0;
          puVar11 = local_68 + paVar1[uVar7].mIndices[lVar10];
          testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                    ((internal *)&local_98,"0U","piNum[idx]",(uint *)&local_b8,puVar11);
          if ((char)local_98._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_b8);
            pcVar8 = "";
            if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
              pcVar8 = *(char **)local_98._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                       ,0xd8,pcVar8);
            testing::internal::AssertHelper::operator=(&local_a8,&local_b8);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (((CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != 0) &&
                (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
               ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,local_b8.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          *puVar11 = *puVar11 - 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        uVar7 = local_70 + 1;
      } while (uVar7 < local_78->mNumFaces);
    }
  }
  if (local_78->mNumVertices != 0) {
    uVar7 = 0;
    do {
      local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,local_68[uVar7] == 0);
      local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_68[uVar7] != 0) {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_98,(internal *)&local_b8,(AssertionResult *)"piNum[i]","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                   ,0xe0,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                          (char)local_98._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p))
          ;
        }
        if (((local_a8.data_ != (AssertHelperData *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_78->mNumVertices);
  }
  Assimp::VertexTriangleAdjacency::~VertexTriangleAdjacency(&local_50);
  return;
}

Assistant:

void VTAdjacencyTest::checkMesh(const aiMesh& mesh)
{
    VertexTriangleAdjacency adj(mesh.mFaces,mesh.mNumFaces,mesh.mNumVertices,true);

    unsigned int* const piNum = adj.mLiveTriangles;

    // check the primary adjacency table and check whether all faces
    // are contained in the list
    unsigned int maxOfs = 0;
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];
            const unsigned int num = piNum[idx];

            // go to this offset
            const unsigned int ofs = adj.mOffsetTable[idx];
            maxOfs = std::max(ofs+num,maxOfs);
            unsigned int* pi = &adj.mAdjacencyTable[ofs];

            // and search for us ...
            unsigned int tt = 0;
            for (; tt < num;++tt,++pi)
            {
                if (i == *pi)
                {
                    // mask our entry in the table. Finally all entries should be masked
                    *pi = 0xffffffff;

                    // there shouldn't be two entries for the same face
                    break;
                }
            }
            // assert if *this* vertex has not been found in the table
            EXPECT_LT(tt, num);
        }
    }

    // now check whether there are invalid faces
    const unsigned int* pi = adj.mAdjacencyTable;
    for (unsigned int i = 0; i < maxOfs;++i,++pi)
    {
        EXPECT_EQ(0xffffffff, *pi);
    }

    // check the numTrianglesPerVertex table
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];

            // we should not reach 0 here ...
            EXPECT_NE(0U, piNum[idx]);
            piNum[idx]--;
        }
    }

    // check whether we reached 0 in all entries
    for (unsigned int i = 0; i < mesh.mNumVertices;++i)
    {
        EXPECT_FALSE(piNum[i]);
    }
}